

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-sdg-dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  LLVMDataDependenceAnalysis *this;
  long lVar2;
  LLVMDataDependenceAnalysisOptions *opts;
  LLVMControlDependenceAnalysis *CDA_00;
  LLVMDataDependenceAnalysis *DDA_00;
  char **in_RSI;
  uint in_EDI;
  StringRef SVar3;
  SDGDumper dumper;
  SystemDependenceGraph sdg;
  LLVMControlDependenceAnalysis CDA;
  LLVMDataDependenceAnalysis DDA;
  DGLLVMPointerAnalysis PTA;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SlicerOptions options;
  LLVMDataDependenceAnalysisOptions *in_stack_fffffffffffff868;
  SlicerOptions *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff878;
  LLVMPointerAnalysis *in_stack_fffffffffffff880;
  Module *in_stack_fffffffffffff888;
  SlicerOptions *in_stack_fffffffffffff898;
  SystemDependenceGraph *in_stack_fffffffffffff8a0;
  undefined1 local_750 [80];
  LLVMPointerAnalysisOptions *in_stack_fffffffffffff900;
  Module *in_stack_fffffffffffff908;
  DGLLVMPointerAnalysis *in_stack_fffffffffffff910;
  char *in_stack_fffffffffffff918;
  SDGDumper *in_stack_fffffffffffff920;
  LLVMDataDependenceAnalysis local_468 [2];
  size_t local_2a8;
  undefined4 local_294;
  char local_290 [8];
  undefined1 local_288 [632];
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  parseSlicerOptions((int)local_288 + 8,(char **)(ulong)local_8,SUB81(local_10,0),false);
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x16187c);
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_288);
  parseModule(local_290,(LLVMContext *)"llvm-sdg-dump",(SlicerOptions *)local_288);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1618c2);
  if (bVar1) {
    this = (LLVMDataDependenceAnalysis *)
           std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator->
                     ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1618ee);
    llvm::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffff870,(string *)in_stack_fffffffffffff868);
    SVar3.Length = local_2a8;
    SVar3.Data = (char *)this;
    lVar2 = llvm::Module::getFunction(SVar3);
    if (lVar2 == 0) {
      llvm::errs();
      llvm::raw_ostream::operator<<
                ((raw_ostream *)in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878);
      llvm::raw_ostream::operator<<
                ((raw_ostream *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      llvm::raw_ostream::operator<<
                ((raw_ostream *)in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878);
      local_4 = 1;
      local_294 = 1;
    }
    else {
      in_stack_fffffffffffff870 =
           (SlicerOptions *)
           std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                     ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16199a);
      dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffff870,
                 (LLVMPointerAnalysisOptions *)in_stack_fffffffffffff868);
      dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffff870);
      dg::DGLLVMPointerAnalysis::run((DGLLVMPointerAnalysis *)in_stack_fffffffffffff870);
      opts = (LLVMDataDependenceAnalysisOptions *)
             std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                       ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1619f5);
      dg::LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
                ((LLVMDataDependenceAnalysisOptions *)in_stack_fffffffffffff870,
                 in_stack_fffffffffffff868);
      dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
                (this,in_stack_fffffffffffff888,in_stack_fffffffffffff880,opts);
      dg::LLVMDataDependenceAnalysisOptions::~LLVMDataDependenceAnalysisOptions
                ((LLVMDataDependenceAnalysisOptions *)in_stack_fffffffffffff870);
      dg::dda::LLVMDataDependenceAnalysis::run
                ((LLVMDataDependenceAnalysis *)in_stack_fffffffffffff870);
      CDA_00 = (LLVMControlDependenceAnalysis *)
               std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                         ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x161a5c);
      dg::LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
                ((LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffff870,
                 (LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffff868);
      dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                ((LLVMControlDependenceAnalysis *)this,in_stack_fffffffffffff888,
                 (LLVMControlDependenceAnalysisOptions *)CDA_00,(LLVMPointerAnalysis *)opts);
      dg::LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions
                ((LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffff870);
      DDA_00 = (LLVMDataDependenceAnalysis *)
               std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                         ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x161ab5);
      memset(local_750,0,0x20);
      dg::llvmdg::SystemDependenceGraphOptions::SystemDependenceGraphOptions
                ((SystemDependenceGraphOptions *)0x161ad5);
      dg::llvmdg::SystemDependenceGraph::SystemDependenceGraph
                (in_stack_fffffffffffff8a0,(Module *)in_stack_fffffffffffff898,
                 (LLVMPointerAnalysis *)this,DDA_00,CDA_00,(SystemDependenceGraphOptions *)opts);
      dg::llvmdg::SystemDependenceGraphOptions::~SystemDependenceGraphOptions
                ((SystemDependenceGraphOptions *)0x161b0b);
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x161b1e);
      SDGDumper::SDGDumper
                ((SDGDumper *)&stack0xfffffffffffff898,(SlicerOptions *)(local_288 + 8),
                 (SystemDependenceGraph *)(local_750 + 0x20),bVar1,0);
      SDGDumper::dumpToDot(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      local_4 = 0;
      local_294 = 1;
      dg::llvmdg::SystemDependenceGraph::~SystemDependenceGraph
                ((SystemDependenceGraph *)in_stack_fffffffffffff870);
      dg::LLVMControlDependenceAnalysis::~LLVMControlDependenceAnalysis
                ((LLVMControlDependenceAnalysis *)in_stack_fffffffffffff870);
      dg::dda::LLVMDataDependenceAnalysis::~LLVMDataDependenceAnalysis(local_468);
      dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis
                ((DGLLVMPointerAnalysis *)in_stack_fffffffffffff870);
    }
  }
  else {
    local_4 = 1;
    local_294 = 1;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffff870);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_288);
  SlicerOptions::~SlicerOptions(in_stack_fffffffffffff870);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-sdg-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    DGLLVMPointerAnalysis PTA(M.get(), options.dgOptions.PTAOptions);
    PTA.run();
    LLVMDataDependenceAnalysis DDA(M.get(), &PTA, options.dgOptions.DDAOptions);
    DDA.run();
    LLVMControlDependenceAnalysis CDA(M.get(), options.dgOptions.CDAOptions);
    // CDA runs on-demand

    llvmdg::SystemDependenceGraph sdg(M.get(), &PTA, &DDA, &CDA);

    SDGDumper dumper(options, &sdg, dump_bb_only);
    dumper.dumpToDot();

    return 0;
}